

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Saig_StrSimTableInsert(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t **ppAVar2;
  
  uVar1 = Saig_StrSimHash(pObj);
  ppAVar2 = ppTable + (int)(uVar1 % (uint)nTableSize);
  if (*ppAVar2 != (Aig_Obj_t *)0x0) {
    ppNexts[pObj->Id] = ppNexts[(*ppAVar2)->Id];
    ppAVar2 = ppNexts + (*ppAVar2)->Id;
  }
  *ppAVar2 = pObj;
  return;
}

Assistant:

void Saig_StrSimTableInsert( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    // find the hash entry
    int iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    if ( ppTable[iEntry] == NULL )
        ppTable[iEntry] = pObj;
    else
    {
        Saig_ObjSetNext( ppNexts, pObj, Saig_ObjNext(ppNexts, ppTable[iEntry]) );
        Saig_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
    }
}